

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined8 uVar1;
  float lhs;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  float *pfVar8;
  uint *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [64];
  uint in_stack_00000010;
  undefined8 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  uint v_new_1;
  float new_clicked_t;
  uint v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_e8;
  float local_e4;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float x1;
  undefined3 in_stack_ffffffffffffff34;
  uint uVar16;
  uint uVar17;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  float local_a4;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined1 is_logarithmic_00;
  float in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float local_78;
  float local_74;
  float in_stack_ffffffffffffff94;
  float zero_deadzone_halfsize_00;
  undefined2 in_stack_ffffffffffffff9c;
  byte bVar18;
  byte bVar19;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 is_logarithmic_01;
  float fVar20;
  float v_min_00;
  float local_44;
  undefined1 extraout_var [56];
  
  uVar1 = _local_74;
  pIVar4 = GImGui;
  is_logarithmic_01 = (undefined1)((uint)in_stack_ffffffffffffffa0 >> 0x18);
  fVar14 = (float)((ulong)_local_74 >> 0x20);
  uVar6 = (uint)((in_stack_00000010 & 0x100000) != 0);
  uVar16 = CONCAT13(1,in_stack_ffffffffffffff34);
  if (in_EDX != 8) {
    uVar16 = CONCAT13(in_EDX == 9,in_stack_ffffffffffffff34);
  }
  uVar17 = uVar16;
  fVar9 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar6);
  fVar10 = ImVec2::operator[](in_RDI,(long)(int)uVar6);
  fVar10 = (fVar9 - fVar10) - 4.0;
  local_44 = (pIVar4->Style).GrabMinSize;
  if (in_R8D < in_R9D) {
    fVar7 = (float)(in_R9D - in_R8D);
  }
  else {
    fVar7 = (float)(in_R8D - in_R9D);
  }
  x1 = fVar7;
  if (((uVar16 & 0x1000000) == 0) && (-1 < (int)fVar7)) {
    local_44 = ImMax<float>(fVar10 / (float)((int)fVar7 + 1),(pIVar4->Style).GrabMinSize);
  }
  fVar11 = ImMin<float>(local_44,fVar10);
  lhs = fVar10 - fVar11;
  fVar12 = ImVec2::operator[](in_RDI,(long)(int)uVar6);
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar11),
                           ZEXT416((uint)(fVar12 + 2.0)));
  fVar12 = auVar3._0_4_;
  fVar13 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar6);
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-fVar11),
                           ZEXT416((uint)(fVar13 - 2.0)));
  fVar13 = auVar3._0_4_;
  v_min_00 = 0.0;
  fVar20 = 0.0;
  if ((in_stack_00000010 & 0x20) != 0) {
    if ((uVar16 & 0x1000000) == 0) {
      in_stack_ffffffffffffff28 = 1.4013e-45;
    }
    else {
      in_stack_ffffffffffffff28 =
           (float)ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff28),
                             (int)in_stack_ffffffffffffff24);
    }
    fVar20 = in_stack_ffffffffffffff28;
    v_min_00 = ImPow(0.0,8.538645e-39);
    is_logarithmic_01 = (undefined1)((uint)fVar20 >> 0x18);
    in_stack_ffffffffffffff24 = (pIVar4->Style).LogSliderDeadzone * 0.5;
    fVar20 = ImMax<float>(lhs,1.0);
    fVar20 = in_stack_ffffffffffffff24 / fVar20;
  }
  is_logarithmic_00 = (undefined1)(in_stack_ffffffffffffff70 >> 0x18);
  bVar19 = 0;
  if (pIVar4->ActiveId == in_ESI) {
    bVar18 = 0;
    zero_deadzone_halfsize_00 = 0.0;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar4->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar8 = ImVec2::operator[](&(pIVar4->IO).MousePos,(long)(int)uVar6);
        in_stack_ffffffffffffff94 = *pfVar8;
        if (lhs <= 0.0) {
          in_stack_ffffffffffffff20 = 0.0;
        }
        else {
          in_stack_ffffffffffffff20 =
               ImClamp<float>((in_stack_ffffffffffffff94 - fVar12) / lhs,0.0,1.0);
        }
        zero_deadzone_halfsize_00 = in_stack_ffffffffffffff20;
        if (uVar6 == 1) {
          zero_deadzone_halfsize_00 = 1.0 - in_stack_ffffffffffffff20;
        }
        bVar18 = 1;
      }
    }
    else {
      if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
        if ((pIVar4->ActiveIdIsJustActivated & 1U) != 0) {
          pIVar4->SliderCurrentAccum = 0.0;
          pIVar4->SliderCurrentAccumDirty = false;
        }
        auVar15._0_8_ =
             GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_ffffffffffffff6c,
                                 (ImGuiInputReadMode)in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
        auVar15._8_56_ = extraout_var;
        uVar1 = vmovlpd_avx(auVar15._0_16_);
        fVar14 = (float)((ulong)uVar1 >> 0x20);
        if (uVar6 == 0) {
          local_74 = (float)uVar1;
          local_e4 = local_74;
        }
        else {
          local_e4 = -fVar14;
        }
        if ((local_e4 != 0.0) || (NAN(local_e4))) {
          if ((uVar16 & 0x1000000) == 0) {
            local_e8 = 0;
          }
          else {
            local_e8 = ImParseFormatPrecision
                                 ((char *)CONCAT44(x1,in_stack_ffffffffffffff28),
                                  (int)in_stack_ffffffffffffff24);
          }
          if (local_e8 < 1) {
            if (((-100.0 <= (float)(int)fVar7) && ((float)(int)fVar7 <= 100.0)) ||
               (bVar5 = IsNavInputDown(0xe), bVar5)) {
              uVar2 = vcmpss_avx512f(ZEXT416((uint)local_e4),(undefined1  [16])0x0,1);
              bVar5 = (bool)((byte)uVar2 & 1);
              local_78 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * 0x3f800000) /
                         (float)(int)fVar7;
            }
            else {
              local_78 = local_e4 / 100.0;
            }
          }
          else {
            local_78 = local_e4 / 100.0;
            bVar5 = IsNavInputDown(0xe);
            if (bVar5) {
              local_78 = local_78 / 10.0;
            }
          }
          bVar5 = IsNavInputDown(0xf);
          if (bVar5) {
            local_78 = local_78 * 10.0;
          }
          pIVar4->SliderCurrentAccum = local_78 + pIVar4->SliderCurrentAccum;
          pIVar4->SliderCurrentAccumDirty = true;
        }
        in_stack_ffffffffffffff80 = pIVar4->SliderCurrentAccum;
        if ((pIVar4->NavActivatePressedId == in_ESI) &&
           ((pIVar4->ActiveIdIsJustActivated & 1U) == 0)) {
          ClearActiveID();
        }
        else if ((pIVar4->SliderCurrentAccumDirty & 1U) != 0) {
          zero_deadzone_halfsize_00 =
               ScaleRatioFromValueT<unsigned_int,int,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                          SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
          if (((1.0 <= zero_deadzone_halfsize_00) && (0.0 < in_stack_ffffffffffffff80)) ||
             ((zero_deadzone_halfsize_00 <= 0.0 && (in_stack_ffffffffffffff80 < 0.0)))) {
            bVar18 = 0;
            pIVar4->SliderCurrentAccum = 0.0;
          }
          else {
            bVar18 = 1;
            fVar7 = ImSaturate(zero_deadzone_halfsize_00 + in_stack_ffffffffffffff80);
            in_stack_ffffffffffffff78 =
                 ScaleValueFromRatioT<unsigned_int,int,float>
                           ((ImGuiDataType)fVar12,fVar13,(uint)v_min_00,(uint)fVar20,
                            (bool)is_logarithmic_01,
                            (float)CONCAT13(bVar19,CONCAT12(bVar18,in_stack_ffffffffffffff9c)),fVar7
                           );
            in_stack_ffffffffffffff7c = zero_deadzone_halfsize_00;
            if ((in_stack_00000010 & 0x40) == 0) {
              in_stack_ffffffffffffff78 =
                   RoundScalarWithFormatT<unsigned_int,int>
                             ((char *)CONCAT17(bVar19,CONCAT16(bVar18,CONCAT24(
                                                  in_stack_ffffffffffffff9c,fVar7))),
                              (ImGuiDataType)in_stack_ffffffffffffff94,(uint)fVar14);
              in_stack_ffffffffffffff7c = zero_deadzone_halfsize_00;
            }
            zero_deadzone_halfsize_00 = fVar7;
            in_stack_ffffffffffffff74 =
                 ScaleRatioFromValueT<unsigned_int,int,float>
                           ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c
                            ,in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                            SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                            in_stack_ffffffffffffff68);
            if (in_stack_ffffffffffffff80 <= 0.0) {
              fVar14 = ImMax<float>(in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c,
                                    in_stack_ffffffffffffff80);
              pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar14;
            }
            else {
              fVar14 = ImMin<float>(in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c,
                                    in_stack_ffffffffffffff80);
              pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar14;
            }
          }
          pIVar4->SliderCurrentAccumDirty = false;
        }
      }
      _local_74 = uVar1;
      fVar14 = (float)((ulong)_local_74 >> 0x20);
    }
    if ((bVar18 & 1) != 0) {
      in_stack_ffffffffffffff70 =
           ScaleValueFromRatioT<unsigned_int,int,float>
                     ((ImGuiDataType)fVar12,fVar13,(uint)v_min_00,(uint)fVar20,
                      (bool)is_logarithmic_01,
                      (float)CONCAT13(bVar19,CONCAT12(bVar18,in_stack_ffffffffffffff9c)),
                      zero_deadzone_halfsize_00);
      if ((in_stack_00000010 & 0x40) == 0) {
        in_stack_ffffffffffffff70 =
             RoundScalarWithFormatT<unsigned_int,int>
                       ((char *)CONCAT17(bVar19,CONCAT16(bVar18,CONCAT24(in_stack_ffffffffffffff9c,
                                                                         zero_deadzone_halfsize_00))
                                        ),(ImGuiDataType)in_stack_ffffffffffffff94,(uint)fVar14);
      }
      if (*in_RCX != in_stack_ffffffffffffff70) {
        *in_RCX = in_stack_ffffffffffffff70;
        bVar19 = 1;
      }
    }
    is_logarithmic_00 = (undefined1)(in_stack_ffffffffffffff70 >> 0x18);
  }
  if (1.0 <= fVar10) {
    local_a4 = ScaleRatioFromValueT<unsigned_int,int,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                          (bool)is_logarithmic_00,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
    if (uVar6 == 1) {
      local_a4 = 1.0 - local_a4;
    }
    fVar14 = ImLerp<float>(fVar12,fVar13,local_a4);
    if (uVar6 == 0) {
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-fVar11),ZEXT416((uint)fVar14));
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar11),ZEXT416((uint)fVar14));
      ImRect::ImRect((ImRect *)CONCAT44(uVar17,fVar9),x1,in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
      *in_stack_00000018 = local_b8;
      in_stack_00000018[1] = local_b0;
    }
    else {
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-fVar11),ZEXT416((uint)fVar14));
      vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar11),ZEXT416((uint)fVar14));
      ImRect::ImRect((ImRect *)CONCAT44(uVar17,fVar9),x1,in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
      *in_stack_00000018 = local_c8;
      in_stack_00000018[1] = local_c0;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff60,in_RDI,in_RDI);
    *in_stack_00000018 = CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    in_stack_00000018[1] = CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  return (bool)(bVar19 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}